

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::createInterface
          (FederateState *this,InterfaceType htype,InterfaceHandle handle,string_view key,
          string_view type,string_view units,uint16_t flags)

{
  InterfaceInfo *this_00;
  undefined7 in_register_00000031;
  int iVar1;
  
  sleeplock(this);
  iVar1 = (int)CONCAT71(in_register_00000031,htype);
  if (iVar1 < 0x70) {
    if (iVar1 != 0x65) {
      if (iVar1 == 0x69) {
        this_00 = &this->interfaceInformation;
        InterfaceInfo::createInput(this_00,handle,key,type,units,flags);
        if (this->strict_input_type_checking == true) {
          InterfaceInfo::setInputProperty(this_00,handle,0x19e,1);
        }
        if (this->ignore_unit_mismatch == true) {
          InterfaceInfo::setInputProperty(this_00,handle,0x1bf,1);
        }
      }
      goto LAB_0031a12e;
    }
  }
  else if (iVar1 != 0x73) {
    if (iVar1 == 0x70) {
      InterfaceInfo::createPublication(&this->interfaceInformation,handle,key,type,units,flags);
    }
    goto LAB_0031a12e;
  }
  InterfaceInfo::createEndpoint(&this->interfaceInformation,handle,key,type,flags);
LAB_0031a12e:
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void FederateState::createInterface(InterfaceType htype,
                                    InterfaceHandle handle,
                                    std::string_view key,
                                    std::string_view type,
                                    std::string_view units,
                                    uint16_t flags)
{
    const std::lock_guard<FederateState> plock(*this);
    // this function could be called externally in a multi-threaded context
    switch (htype) {
        case InterfaceType::PUBLICATION:
            interfaceInformation.createPublication(handle, key, type, units, flags);

            break;
        case InterfaceType::INPUT:
            interfaceInformation.createInput(handle, key, type, units, flags);
            if (strict_input_type_checking) {
                interfaceInformation.setInputProperty(handle,
                                                      defs::Options::STRICT_TYPE_CHECKING,
                                                      1);
            }
            if (ignore_unit_mismatch) {
                interfaceInformation.setInputProperty(handle,
                                                      defs::Options::IGNORE_UNIT_MISMATCH,
                                                      1);
            }
            break;
        case InterfaceType::ENDPOINT:
        case InterfaceType::SINK:
            interfaceInformation.createEndpoint(handle, key, type, flags);
            break;
        default:
            break;
    }
}